

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAndiEa<(moira::Instr)60,(moira::Mode)4,(moira::Size)4>(Moira *this,u16 opcode)

{
  int *piVar1;
  u16 uVar2;
  u16 uVar3;
  u32 addr;
  u32 uVar4;
  undefined8 in_RAX;
  uint uVar5;
  uint uVar6;
  bool error;
  bool local_31;
  
  local_31 = SUB81((ulong)in_RAX >> 0x38,0);
  uVar2 = (this->queue).irc;
  readExt(this);
  uVar3 = (this->queue).irc;
  readExt(this);
  addr = computeEA<(moira::Mode)4,(moira::Size)4,0ul>(this,opcode & 7);
  uVar4 = readM<(moira::MemSpace)1,(moira::Size)4,0ul>(this,addr,&local_31);
  piVar1 = (int *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x38);
  *piVar1 = *piVar1 + -4;
  if (local_31 == false) {
    uVar5 = CONCAT22(uVar2,uVar3);
    uVar6 = uVar4 ^ uVar5;
    (this->reg).sr.n = SUB41(uVar6 >> 0x1f,0);
    (this->reg).sr.z = uVar5 == uVar4;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    uVar4 = (this->reg).pc;
    (this->reg).pc0 = uVar4;
    (this->queue).ird = (this->queue).irc;
    uVar4 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar4 + 2);
    (this->queue).irc = (u16)uVar4;
    writeM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,addr + 2,uVar6 & 0xffff);
    writeM<(moira::MemSpace)1,(moira::Size)2,5ul>(this,addr,uVar6 >> 0x10);
  }
  return;
}

Assistant:

void
Moira::execAndiEa(u16 opcode)
{
    u32 ea, data, result;

    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    result = logic<I,S>(src, data);
    prefetch();

    writeOp <M,S, POLLIPL | REVERSE> (dst, ea, result);
}